

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitive_column_writer.cpp
# Opt level: O0

idx_t __thiscall
duckdb::PrimitiveColumnWriter::GetRowSize
          (PrimitiveColumnWriter *this,Vector *vector,idx_t index,PrimitiveColumnWriterState *state)

{
  string *msg;
  allocator *this_00;
  allocator local_41;
  string local_40 [64];
  
  msg = (string *)__cxa_allocate_exception(0x10);
  this_00 = &local_41;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_40,"GetRowSize unsupported for struct/list column writers",this_00);
  InternalException::InternalException((InternalException *)this_00,msg);
  __cxa_throw(msg,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

idx_t PrimitiveColumnWriter::GetRowSize(const Vector &vector, const idx_t index,
                                        const PrimitiveColumnWriterState &state) const {
	throw InternalException("GetRowSize unsupported for struct/list column writers");
}